

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O1

sexp sexp_subbytes_op(sexp ctx,sexp self,sexp_sint_t n,sexp vec,sexp start,sexp end)

{
  sexp psVar1;
  sexp_uint_t type_id;
  sexp_sint_t n_00;
  sexp str;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp local_40;
  sexp_gc_var_t local_38;
  
  local_40 = (sexp)0x43e;
  local_38.var = (sexp_conflict *)0x0;
  local_38.next = (sexp_gc_var_t *)0x0;
  if ((((ulong)vec & 3) == 0) && (vec->tag == 8)) {
    if (((ulong)start & 1) == 0) {
      type_id = 2;
      end = start;
    }
    else {
      if (end == (sexp)&DAT_0000003e) {
        end = (sexp)((vec->value).stack.length * 2 + 1);
      }
      if (((ulong)end & 1) != 0) {
        local_38.var = &local_40;
        local_38.next = (ctx->value).context.saves;
        (ctx->value).context.saves = &local_38;
        local_40 = (sexp)sexp_alloc(ctx,0x20);
        if ((local_40 != (sexp)0x0) && ((((ulong)local_40 & 3) != 0 || (local_40->tag != 0x13)))) {
          local_40->tag = 9;
        }
        (local_40->value).type.name = vec;
        (local_40->value).type.cpl = (sexp)0x0;
        (local_40->value).type.slots = (sexp)(vec->value).flonum;
        psVar1 = sexp_substring_op(ctx,self,n_00,local_40,
                                   (sexp)(((ulong)start & 0xfffffffffffffffe) * 4 + 2),
                                   (sexp)(((ulong)end & 0xfffffffffffffffe) * 4 + 2));
        if ((((ulong)psVar1 & 3) != 0) || (psVar1->tag != 0x13)) {
          psVar1 = (sexp)(psVar1->value).flonum;
        }
        (ctx->value).context.saves = local_38.next;
        return psVar1;
      }
      type_id = 2;
    }
  }
  else {
    type_id = 8;
    end = vec;
  }
  psVar1 = sexp_type_exception(ctx,self,type_id,end);
  return psVar1;
}

Assistant:

sexp sexp_subbytes_op (sexp ctx, sexp self, sexp_sint_t n, sexp vec, sexp start, sexp end) {
  sexp res;
  sexp_gc_var1(str);
  sexp_assert_type(ctx, sexp_bytesp, SEXP_BYTES, vec);
  sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, start);
  if (sexp_not(end))
    end = sexp_make_fixnum(sexp_bytes_length(vec));
  sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, end);
  sexp_gc_preserve1(ctx, str);
#if SEXP_USE_PACKED_STRINGS
  str = sexp_c_string(ctx, sexp_bytes_data(vec), sexp_bytes_length(vec));
#else
  str = sexp_alloc_type(ctx, string, SEXP_STRING);
  sexp_string_bytes(str) = vec;
  sexp_string_offset(str) = 0;
  sexp_string_size(str) = sexp_bytes_length(vec);
#endif
  res = sexp_substring_op(ctx, self, n, str, sexp_fixnum_to_string_cursor(start), sexp_fixnum_to_string_cursor(end));
  if (!sexp_exceptionp(res))
    res = sexp_string_to_bytes(ctx, res);
  sexp_gc_release1(ctx);
  return res;
}